

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O2

void __thiscall NaPNDelay::initialize(NaPNDelay *this,bool *starter)

{
  uint uVar1;
  int iVar2;
  NaVector *pNVar3;
  uint uVar4;
  
  uVar4 = this->nMaxLag + 1;
  uVar1 = 0;
  if (this->bSleepValue != false) {
    uVar1 = uVar4;
  }
  this->nActiveSleep = uVar1;
  pNVar3 = NaPetriCnInput::data(&this->in);
  iVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
  NaVector::new_dim(&this->vBuffer,uVar4 * iVar2);
  NaVector::init_value(&this->vBuffer,this->fSleepValue);
  return;
}

Assistant:

void
NaPNDelay::initialize (bool& starter)
{
  if(bSleepValue)
    nActiveSleep = nMaxLag + 1;
  else
    nActiveSleep = 0;
  vBuffer.new_dim((1 + nMaxLag) * in.data().dim());
  vBuffer.init_value(fSleepValue);
}